

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O1

void ncnn::cast_int8_to_float32(Mat *src,Mat *dst,Option *opt)

{
  int *piVar1;
  void *__ptr;
  long *plVar2;
  Layer *pLVar3;
  long lVar4;
  ParamDict pd;
  ParamDict PStack_928;
  
  pLVar3 = create_layer(0x40);
  ParamDict::ParamDict(&PStack_928);
  ParamDict::set(&PStack_928,0,3);
  ParamDict::set(&PStack_928,1,1);
  (*pLVar3->_vptr_Layer[2])(pLVar3,&PStack_928);
  (*pLVar3->_vptr_Layer[4])(pLVar3,opt);
  (*pLVar3->_vptr_Layer[7])(pLVar3,src,dst,opt);
  (*pLVar3->_vptr_Layer[5])(pLVar3,opt);
  (*pLVar3->_vptr_Layer[1])(pLVar3);
  lVar4 = 0x8c0;
  do {
    piVar1 = *(int **)((long)&PStack_928.params[0].v.data + lVar4);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        __ptr = *(void **)((long)&PStack_928.params[0].type + lVar4);
        plVar2 = *(long **)((long)&PStack_928.params[0].v.elempack + lVar4);
        if (plVar2 == (long *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*plVar2 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&PStack_928.params[0].v.data + lVar4 + 4) = 0;
    *(undefined8 *)((long)&PStack_928.params[0].v.refcount + lVar4 + 4) = 0;
    *(undefined8 *)((long)&PStack_928.params[0].type + lVar4) = 0;
    *(undefined8 *)((long)&PStack_928.params[0].v.data + lVar4) = 0;
    *(undefined8 *)((long)&PStack_928.params[0].v.allocator + lVar4) = 0;
    *(undefined8 *)((long)&PStack_928.params[0].v.dims + lVar4) = 0;
    *(undefined8 *)((long)&PStack_928.params[0].v.h + lVar4) = 0;
    lVar4 = lVar4 + -0x48;
  } while (lVar4 != -0x40);
  return;
}

Assistant:

void cast_int8_to_float32(const Mat& src, Mat& dst, const Option& opt)
{
    Layer* cast = create_layer(LayerType::Cast);

    ParamDict pd;
    pd.set(0, 3);
    pd.set(1, 1);

    cast->load_param(pd);

    cast->create_pipeline(opt);

    cast->forward(src, dst, opt);

    cast->destroy_pipeline(opt);

    delete cast;
}